

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

int detect_transition_to_still
              (FIRSTPASS_INFO *firstpass_info,int next_stats_index,int min_gf_interval,
              int frame_interval,int still_interval,double loop_decay_rate,double last_decay_rate)

{
  int iVar1;
  FIRSTPASS_STATS *pFVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  FIRSTPASS_INFO *in_RDI;
  int in_R8D;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  FIRSTPASS_STATS *stats;
  int j;
  int stats_left;
  int local_38;
  uint local_4;
  
  if ((((in_ECX <= in_EDX) || (in_XMM0_Qa < 0.999)) || (0.9 <= in_XMM1_Qa)) ||
     (iVar1 = av1_firstpass_info_future_count(in_RDI,in_ESI), iVar1 < in_R8D)) {
    local_4 = 0;
  }
  else {
    local_38 = 0;
    while ((local_38 < in_R8D &&
           (pFVar2 = av1_firstpass_info_peek(in_RDI,in_ESI + local_38),
           0.999 <= pFVar2->pcnt_inter - pFVar2->pcnt_motion))) {
      local_38 = local_38 + 1;
    }
    local_4 = (uint)(local_38 == in_R8D);
  }
  return local_4;
}

Assistant:

static int detect_transition_to_still(const FIRSTPASS_INFO *firstpass_info,
                                      int next_stats_index,
                                      const int min_gf_interval,
                                      const int frame_interval,
                                      const int still_interval,
                                      const double loop_decay_rate,
                                      const double last_decay_rate) {
  // Break clause to detect very still sections after motion
  // For example a static image after a fade or other transition
  // instead of a clean scene cut.
  if (frame_interval > min_gf_interval && loop_decay_rate >= 0.999 &&
      last_decay_rate < 0.9) {
    int stats_left =
        av1_firstpass_info_future_count(firstpass_info, next_stats_index);
    if (stats_left >= still_interval) {
      int j;
      // Look ahead a few frames to see if static condition persists...
      for (j = 0; j < still_interval; ++j) {
        const FIRSTPASS_STATS *stats =
            av1_firstpass_info_peek(firstpass_info, next_stats_index + j);
        if (stats->pcnt_inter - stats->pcnt_motion < 0.999) break;
      }
      // Only if it does do we signal a transition to still.
      return j == still_interval;
    }
  }
  return 0;
}